

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  ai_real aVar1;
  ai_real aVar2;
  ai_real aVar3;
  Type TVar4;
  uint uVar5;
  Shader SVar6;
  Face *pFVar7;
  pointer pVVar8;
  undefined8 uVar9;
  pointer pMVar10;
  element_type *peVar11;
  _Map_pointer pppNVar12;
  Node **ppNVar13;
  Node **ppNVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  aiScene *paVar31;
  COBImporter *this_00;
  long *plVar32;
  pointer pMVar33;
  uint uVar34;
  int iVar35;
  Material *m;
  aiNode *paVar36;
  aiMesh *paVar37;
  ulong uVar38;
  aiVector3D *paVar39;
  ulong *puVar40;
  aiFace *paVar41;
  long lVar42;
  uint *puVar43;
  pointer pVVar44;
  pointer pMVar45;
  Logger *this_01;
  pointer pMVar46;
  aiMaterial *this_02;
  _Rb_tree_node_base *p_Var47;
  aiLight *paVar48;
  aiCamera *paVar49;
  aiNode **__s;
  aiNode *paVar50;
  _Map_pointer pppFVar51;
  aiFace *paVar52;
  _Elt_pointer ppFVar53;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4;
  _Map_pointer pppNVar54;
  Light *ndlight;
  _Elt_pointer ppFVar55;
  _Elt_pointer ppFVar56;
  ulong uVar57;
  Node **ppNVar58;
  size_t __n;
  bool bVar59;
  unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_> defmat;
  aiColor3D c;
  aiString s;
  pointer local_6a0;
  aiScene *local_698;
  aiNode *local_690;
  _Map_pointer local_688;
  Scene *local_680;
  _Elt_pointer local_678;
  shared_ptr<Assimp::COB::Texture> local_670;
  shared_ptr<Assimp::COB::Texture> local_660;
  shared_ptr<Assimp::COB::Texture> local_650;
  COBImporter *local_640;
  _Rb_tree_node_base *local_638;
  _Rb_tree_node_base *local_630;
  _Rb_tree_color local_628;
  _Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> local_620;
  long *local_5d0;
  ulong local_5c8;
  long local_5c0 [2];
  float local_5b0;
  float fStack_5ac;
  float local_5a8;
  long local_5a0 [12];
  ios_base local_540 [264];
  aiString local_438;
  
  local_698 = fill;
  local_680 = scin;
  paVar36 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar36);
  uVar57 = (root->name)._M_string_length;
  if (uVar57 < 0x400) {
    (paVar36->mName).length = (ai_uint32)uVar57;
    memcpy((paVar36->mName).data,(root->name)._M_dataplus._M_p,uVar57);
    (paVar36->mName).data[uVar57] = '\0';
  }
  fVar27 = (root->transform).a1;
  fVar28 = (root->transform).a2;
  fVar29 = (root->transform).a3;
  fVar30 = (root->transform).a4;
  fVar23 = (root->transform).b1;
  fVar24 = (root->transform).b2;
  fVar25 = (root->transform).b3;
  fVar26 = (root->transform).b4;
  fVar19 = (root->transform).c1;
  fVar20 = (root->transform).c2;
  fVar21 = (root->transform).c3;
  fVar22 = (root->transform).c4;
  fVar16 = (root->transform).d2;
  fVar17 = (root->transform).d3;
  fVar18 = (root->transform).d4;
  (paVar36->mTransformation).d1 = (root->transform).d1;
  (paVar36->mTransformation).d2 = fVar16;
  (paVar36->mTransformation).d3 = fVar17;
  (paVar36->mTransformation).d4 = fVar18;
  (paVar36->mTransformation).c1 = fVar19;
  (paVar36->mTransformation).c2 = fVar20;
  (paVar36->mTransformation).c3 = fVar21;
  (paVar36->mTransformation).c4 = fVar22;
  (paVar36->mTransformation).b1 = fVar23;
  (paVar36->mTransformation).b2 = fVar24;
  (paVar36->mTransformation).b3 = fVar25;
  (paVar36->mTransformation).b4 = fVar26;
  (paVar36->mTransformation).a1 = fVar27;
  (paVar36->mTransformation).a2 = fVar28;
  (paVar36->mTransformation).a3 = fVar29;
  (paVar36->mTransformation).a4 = fVar30;
  TVar4 = root->type;
  local_690 = paVar36;
  local_640 = this;
  if (TVar4 == TYPE_CAMERA) {
    paVar49 = (aiCamera *)operator_new(0x438);
    (paVar49->mName).length = 0;
    (paVar49->mName).data[0] = '\0';
    memset((paVar49->mName).data + 1,0x1b,0x3ff);
    (paVar49->mPosition).x = 0.0;
    (paVar49->mPosition).y = 0.0;
    *(undefined8 *)&(paVar49->mPosition).z = 0;
    (paVar49->mUp).y = 1.0;
    (paVar49->mUp).z = 0.0;
    (paVar49->mLookAt).x = 0.0;
    (paVar49->mLookAt).y = 0.0;
    *(undefined8 *)&(paVar49->mLookAt).z = 0x3f490fdb3f800000;
    paVar49->mClipPlaneNear = 0.1;
    paVar49->mClipPlaneFar = 1000.0;
    paVar49->mAspect = 0.0;
    uVar34 = local_698->mNumCameras;
    local_698->mNumCameras = uVar34 + 1;
    local_698->mCameras[uVar34] = paVar49;
    uVar57 = (root->name)._M_string_length;
    if (uVar57 < 0x400) {
      (paVar49->mName).length = (ai_uint32)uVar57;
      memcpy((paVar49->mName).data,(root->name)._M_dataplus._M_p,uVar57);
      (paVar49->mName).data[uVar57] = '\0';
    }
  }
  else if (TVar4 == TYPE_LIGHT) {
    paVar48 = (aiLight *)operator_new(0x46c);
    (paVar48->mName).length = 0;
    (paVar48->mName).data[0] = '\0';
    memset((paVar48->mName).data + 1,0x1b,0x3ff);
    paVar48->mType = aiLightSource_UNDEFINED;
    (paVar48->mPosition).x = 0.0;
    (paVar48->mPosition).y = 0.0;
    (paVar48->mPosition).z = 0.0;
    (paVar48->mDirection).x = 0.0;
    (paVar48->mDirection).y = 0.0;
    *(undefined8 *)&(paVar48->mDirection).z = 0;
    (paVar48->mUp).x = 0.0;
    (paVar48->mUp).y = 0.0;
    *(undefined8 *)&(paVar48->mUp).z = 0;
    paVar48->mAttenuationLinear = 1.0;
    paVar48->mAttenuationQuadratic = 0.0;
    (paVar48->mColorDiffuse).r = 0.0;
    (paVar48->mColorDiffuse).g = 0.0;
    (paVar48->mColorDiffuse).b = 0.0;
    (paVar48->mColorSpecular).r = 0.0;
    (paVar48->mColorSpecular).g = 0.0;
    *(undefined8 *)&(paVar48->mColorSpecular).b = 0;
    (paVar48->mColorAmbient).g = 0.0;
    (paVar48->mColorAmbient).b = 0.0;
    paVar48->mAngleInnerCone = 6.2831855;
    paVar48->mAngleOuterCone = 6.2831855;
    (paVar48->mSize).x = 0.0;
    (paVar48->mSize).y = 0.0;
    uVar34 = local_698->mNumLights;
    local_698->mNumLights = uVar34 + 1;
    local_698->mLights[uVar34] = paVar48;
    uVar57 = (root->name)._M_string_length;
    if (uVar57 < 0x400) {
      (paVar48->mName).length = (ai_uint32)uVar57;
      memcpy((paVar48->mName).data,(root->name)._M_dataplus._M_p,uVar57);
      (paVar48->mName).data[uVar57] = '\0';
    }
    aVar1 = *(ai_real *)&root->field_0xd4;
    (paVar48->mColorSpecular).r = aVar1;
    aVar2 = *(ai_real *)&root[1]._vptr_Node;
    (paVar48->mColorSpecular).g = aVar2;
    aVar3 = *(ai_real *)((long)&root[1]._vptr_Node + 4);
    (paVar48->mColorSpecular).b = aVar3;
    (paVar48->mColorAmbient).r = aVar1;
    (paVar48->mColorAmbient).g = aVar2;
    (paVar48->mColorAmbient).b = aVar3;
    (paVar48->mColorDiffuse).r = aVar1;
    (paVar48->mColorDiffuse).g = aVar2;
    (paVar48->mColorDiffuse).b = aVar3;
    paVar48->mAngleOuterCone = (float)root[1].super_ChunkInfo.id * 0.017453292;
    paVar48->mAngleInnerCone = (float)root[1].super_ChunkInfo.parent_id * 0.017453292;
    paVar48->mType = (uint)(root[1].super_ChunkInfo.version == 0) * 2 + aiLightSource_DIRECTIONAL;
  }
  else if (((TVar4 == TYPE_MESH) &&
           (root[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&root[1].type)) &&
          (*(_func_int ***)&root[1].super_ChunkInfo != root[1]._vptr_Node)) {
    p_Var47 = (_Rb_tree_node_base *)
              root[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_638 = (_Rb_tree_node_base *)
                &root[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (p_Var47 != local_638) {
      do {
        local_628 = p_Var47[1]._M_color;
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::deque
                  ((deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)&local_620,
                   (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                   &p_Var47[1]._M_parent);
        if (local_620._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_620._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          uVar57 = 0;
        }
        else {
          uVar57 = 0;
          pppFVar51 = local_620._M_impl.super__Deque_impl_data._M_start._M_node;
          ppFVar53 = local_620._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar55 = local_620._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            ppFVar56 = ppFVar55 + 1;
            if (ppFVar56 == ppFVar53) {
              ppFVar56 = pppFVar51[1];
              pppFVar51 = pppFVar51 + 1;
              ppFVar53 = ppFVar56 + 0x40;
            }
            uVar57 = uVar57 + ((long)((*ppFVar55)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((*ppFVar55)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
            ppFVar55 = ppFVar56;
          } while (ppFVar56 != local_620._M_impl.super__Deque_impl_data._M_finish._M_cur);
        }
        if (uVar57 != 0) {
          local_630 = p_Var47;
          paVar37 = (aiMesh *)operator_new(0x520);
          paVar37->mPrimitiveTypes = 0;
          paVar37->mNumVertices = 0;
          paVar37->mNumFaces = 0;
          memset(&paVar37->mVertices,0,0xcc);
          paVar37->mBones = (aiBone **)0x0;
          paVar37->mMaterialIndex = 0;
          (paVar37->mName).length = 0;
          (paVar37->mName).data[0] = '\0';
          memset((paVar37->mName).data + 1,0x1b,0x3ff);
          paVar37->mNumAnimMeshes = 0;
          paVar37->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar37->mMethod = 0;
          (paVar37->mAABB).mMin.x = 0.0;
          (paVar37->mAABB).mMin.y = 0.0;
          (paVar37->mAABB).mMin.z = 0.0;
          (paVar37->mAABB).mMax.x = 0.0;
          (paVar37->mAABB).mMax.y = 0.0;
          (paVar37->mAABB).mMax.z = 0.0;
          paVar37->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar37->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar37->mNumUVComponents[0] = 0;
          paVar37->mNumUVComponents[1] = 0;
          paVar37->mNumUVComponents[2] = 0;
          paVar37->mNumUVComponents[3] = 0;
          paVar37->mNumUVComponents[4] = 0;
          paVar37->mNumUVComponents[5] = 0;
          paVar37->mNumUVComponents[6] = 0;
          paVar37->mNumUVComponents[7] = 0;
          paVar37->mColors[0] = (aiColor4D *)0x0;
          paVar37->mColors[1] = (aiColor4D *)0x0;
          paVar37->mColors[2] = (aiColor4D *)0x0;
          paVar37->mColors[3] = (aiColor4D *)0x0;
          paVar37->mColors[4] = (aiColor4D *)0x0;
          paVar37->mColors[5] = (aiColor4D *)0x0;
          paVar37->mColors[6] = (aiColor4D *)0x0;
          paVar37->mColors[7] = (aiColor4D *)0x0;
          uVar34 = local_698->mNumMeshes;
          local_698->mNumMeshes = uVar34 + 1;
          local_698->mMeshes[uVar34] = paVar37;
          local_690->mNumMeshes = local_690->mNumMeshes + 1;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar57;
          uVar38 = SUB168(auVar15 * ZEXT816(0xc),0);
          if (SUB168(auVar15 * ZEXT816(0xc),8) != 0) {
            uVar38 = 0xffffffffffffffff;
          }
          paVar39 = (aiVector3D *)operator_new__(uVar38);
          uVar57 = uVar57 * 0xc - 0xc;
          memset(paVar39,0,(uVar57 / 0xc) * 0xc + 0xc);
          paVar37->mVertices = paVar39;
          paVar39 = (aiVector3D *)operator_new__(uVar38);
          memset(paVar39,0,(uVar57 / 0xc) * 0xc + 0xc);
          ppFVar53 = local_620._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar55 = local_620._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_688 = local_620._M_impl.super__Deque_impl_data._M_start._M_node;
          paVar37->mTextureCoords[0] = paVar39;
          local_678 = local_620._M_impl.super__Deque_impl_data._M_finish._M_cur;
          uVar57 = ((long)local_620._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_620._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)local_620._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_620._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)local_620._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_620._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                    - 1) + (ulong)(local_620._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x40;
          puVar40 = (ulong *)operator_new__(-(ulong)(uVar57 >> 0x3c != 0) | uVar57 * 0x10 | 8);
          *puVar40 = uVar57;
          paVar41 = (aiFace *)(puVar40 + 1);
          if (uVar57 != 0) {
            paVar52 = paVar41;
            do {
              paVar52->mNumIndices = 0;
              paVar52->mIndices = (uint *)0x0;
              paVar52 = paVar52 + 1;
            } while (paVar52 != paVar41 + uVar57);
          }
          paVar37->mFaces = paVar41;
          while (paVar31 = local_698, ppFVar55 != local_678) {
            pFVar7 = *ppFVar55;
            if ((pFVar7->indices).
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pFVar7->indices).
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              uVar34 = paVar37->mNumFaces;
              paVar37->mNumFaces = uVar34 + 1;
              paVar41 = paVar37->mFaces + uVar34;
              lVar42 = (long)(pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar57 = lVar42 >> 1;
              if (lVar42 < 0) {
                uVar57 = 0xffffffffffffffff;
              }
              puVar43 = (uint *)operator_new__(uVar57);
              paVar41->mIndices = puVar43;
              pVVar8 = (pFVar7->indices).
                       super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pVVar44 = (pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start; pVVar44 != pVVar8;
                  pVVar44 = pVVar44 + 1) {
                uVar57 = (ulong)pVVar44->pos_idx;
                lVar42 = *(long *)&root[1].type;
                uVar38 = ((long)root[1].temp_children.
                                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_map - lVar42 >> 2) *
                         -0x5555555555555555;
                if (uVar38 < uVar57 || uVar38 - uVar57 == 0) {
                  local_438._0_8_ = local_438.data + 0xc;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_438,"Position index out of range","");
                  ThrowException((string *)&local_438);
                }
                if ((ulong)(*(long *)&root[1].super_ChunkInfo - (long)root[1]._vptr_Node >> 3) <=
                    (ulong)pVVar44->uv_idx) {
                  local_438._0_8_ = local_438.data + 0xc;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_438,"UV index out of range","");
                  ThrowException((string *)&local_438);
                }
                paVar39 = paVar37->mVertices;
                uVar34 = paVar37->mNumVertices;
                paVar39[uVar34].z = *(float *)(lVar42 + 8 + uVar57 * 0xc);
                uVar9 = *(undefined8 *)(lVar42 + uVar57 * 0xc);
                paVar39 = paVar39 + uVar34;
                paVar39->x = (float)(int)uVar9;
                paVar39->y = (float)(int)((ulong)uVar9 >> 0x20);
                paVar39 = paVar37->mTextureCoords[0];
                uVar34 = paVar37->mNumVertices;
                *(_func_int **)(paVar39 + uVar34) = root[1]._vptr_Node[pVVar44->uv_idx];
                paVar39[uVar34].z = 0.0;
                uVar34 = paVar37->mNumVertices;
                paVar37->mNumVertices = uVar34 + 1;
                uVar5 = paVar41->mNumIndices;
                paVar41->mNumIndices = uVar5 + 1;
                paVar41->mIndices[uVar5] = uVar34;
              }
            }
            ppFVar55 = ppFVar55 + 1;
            if (ppFVar55 == ppFVar53) {
              ppFVar55 = local_688[1];
              local_688 = local_688 + 1;
              ppFVar53 = ppFVar55 + 0x40;
            }
          }
          paVar37->mMaterialIndex = local_698->mNumMaterials;
          pMVar45 = (local_680->materials).
                    super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (local_680->materials).
                    super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pMVar45 == pMVar10) {
            pMVar46 = (pointer)0x0;
          }
          else {
            pMVar46 = (pointer)0x0;
            do {
              if (((pMVar45->super_ChunkInfo).parent_id != (root->super_ChunkInfo).id) ||
                 (bVar59 = true, pMVar33 = pMVar45, pMVar45->matnum != local_628)) {
                bVar59 = false;
                pMVar33 = pMVar46;
              }
              pMVar46 = pMVar33;
            } while ((!bVar59) && (pMVar45 = pMVar45 + 1, pMVar45 != pMVar10));
          }
          local_6a0 = (pointer)0x0;
          if (pMVar46 == (pointer)0x0) {
            this_01 = DefaultLogger::get();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,"Could not resolve material index ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438," - creating default material for this slot",0x2a);
            std::__cxx11::stringbuf::str();
            Logger::debug(this_01,(char *)CONCAT44(fStack_5ac,local_5b0));
            if ((long *)CONCAT44(fStack_5ac,local_5b0) != local_5a0) {
              operator_delete((long *)CONCAT44(fStack_5ac,local_5b0),local_5a0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
            std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
            pMVar46 = (pointer)operator_new(0x90);
            pMVar45 = local_6a0;
            (pMVar46->super_ChunkInfo).id = 0;
            (pMVar46->super_ChunkInfo).parent_id = 0;
            (pMVar46->super_ChunkInfo).version = 0;
            (pMVar46->super_ChunkInfo).size = 0xffffffff;
            (pMVar46->type)._M_dataplus._M_p = (pointer)&(pMVar46->type).field_2;
            (pMVar46->type)._M_string_length = 0;
            (pMVar46->type).field_2._M_local_buf[0] = '\0';
            (pMVar46->rgb).r = 0.0;
            (pMVar46->rgb).g = 0.0;
            *(undefined8 *)&(pMVar46->rgb).b = 0;
            pMVar46->alpha = 0.0;
            pMVar46->exp = 0.0;
            pMVar46->ior = 0.0;
            pMVar46->ka = 0.0;
            pMVar46->ks = 1.0;
            pMVar46->matnum = 0xffffffff;
            pMVar46->shader = FLAT;
            pMVar46->autofacet = FACETED;
            *(undefined8 *)&pMVar46->autofacet_angle = 0;
            *(undefined8 *)
             ((long)&(pMVar46->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar46->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            *(undefined8 *)
             ((long)&(pMVar46->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar46->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            (pMVar46->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pMVar46->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar59 = local_6a0 != (Material *)0x0;
            local_6a0 = pMVar46;
            if (bVar59) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_6a0,pMVar45);
            }
          }
          this_02 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_02);
          uVar34 = paVar31->mNumMaterials;
          paVar31->mNumMaterials = uVar34 + 1;
          paVar31->mMaterials[uVar34] = this_02;
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[6]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_5b0,(char (*) [6])"#mat_");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b0,"_",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
          std::__cxx11::stringbuf::str();
          plVar32 = local_5d0;
          __n = local_5c8 & 0xffffffff;
          if ((local_5c8 & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          local_438.length = (ai_uint32)__n;
          memcpy((void *)((long)&local_438 + 4),local_5d0,__n);
          *(undefined1 *)((long)&local_438 + __n + 4) = 0;
          if (plVar32 != local_5c0) {
            operator_delete(plVar32,local_5c0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
          std::ios_base::~ios_base(local_540);
          aiMaterial::AddProperty(this_02,&local_438,"?mat.name",0,0);
          p_Var47 = local_630;
          uVar34 = *(uint *)&root[1].temp_children.
                             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node & 4;
          local_5b0 = (float)(uVar34 >> 2);
          if (uVar34 != 0) {
            aiMaterial::AddBinaryProperty(this_02,&local_5b0,4,"$mat.wireframe",0,0,aiPTI_Integer);
          }
          SVar6 = pMVar46->shader;
          if (SVar6 == METAL) {
            local_5b0 = 1.12104e-44;
          }
          else if (SVar6 == PHONG) {
            local_5b0 = 4.2039e-45;
          }
          else {
            if (SVar6 != FLAT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/COB/COBLoader.cpp"
                            ,0x152,
                            "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                           );
            }
            local_5b0 = 2.8026e-45;
          }
          aiMaterial::AddBinaryProperty(this_02,&local_5b0,4,"$mat.shadingm",0,0,aiPTI_Integer);
          if (local_5b0 != 2.8026e-45) {
            aiMaterial::AddBinaryProperty(this_02,&pMVar46->exp,4,"$mat.shininess",0,0,aiPTI_Float);
          }
          aiMaterial::AddBinaryProperty(this_02,&pMVar46->ior,4,"$mat.refracti",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty(this_02,&pMVar46->rgb,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          local_5a8 = pMVar46->ks;
          local_5b0 = (pMVar46->rgb).r * local_5a8;
          fStack_5ac = (pMVar46->rgb).g * local_5a8;
          local_5a8 = local_5a8 * (pMVar46->rgb).b;
          aiMaterial::AddBinaryProperty(this_02,&local_5b0,0xc,"$clr.specular",0,0,aiPTI_Float);
          local_5a8 = pMVar46->ka;
          local_5b0 = (pMVar46->rgb).r * local_5a8;
          fStack_5ac = (pMVar46->rgb).g * local_5a8;
          local_5a8 = local_5a8 * (pMVar46->rgb).b;
          aiMaterial::AddBinaryProperty(this_02,&local_5b0,0xc,"$clr.ambient",0,0,aiPTI_Float);
          peVar11 = (pMVar46->tex_color).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar46->tex_color).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_650,this_02,aiTextureType_DIFFUSE);
            if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_650.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          peVar11 = (pMVar46->tex_env).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar46->tex_env).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_660,this_02,aiTextureType_UNKNOWN);
            if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_660.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          peVar11 = (pMVar46->tex_bump).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar46->tex_bump).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_670,this_02,aiTextureType_HEIGHT);
            if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_670.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_6a0 != (Material *)0x0) {
            std::default_delete<const_Assimp::COB::Material>::operator()
                      ((default_delete<const_Assimp::COB::Material> *)&local_6a0,local_6a0);
          }
        }
        std::_Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::~_Deque_base
                  (&local_620);
        p_Var47 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var47);
      } while (p_Var47 != local_638);
    }
  }
  paVar36 = local_690;
  paVar31 = local_698;
  if ((ulong)local_690->mNumMeshes != 0) {
    puVar43 = (uint *)operator_new__((ulong)local_690->mNumMeshes << 2);
    paVar36->mMeshes = puVar43;
    if (paVar36->mNumMeshes != 0) {
      iVar35 = -1;
      uVar57 = 0;
      do {
        paVar36->mMeshes[uVar57] = paVar31->mNumMeshes + iVar35;
        uVar57 = uVar57 + 1;
        iVar35 = iVar35 + -1;
      } while (uVar57 < paVar36->mNumMeshes);
    }
  }
  pppNVar12 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppNVar54 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppNVar13 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppNVar58 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppNVar14 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar57 = ((long)ppNVar14 - (long)ppNVar58 >> 3) +
           ((long)ppNVar13 -
            (long)(root->temp_children).
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppNVar12 - (long)pppNVar54) >> 3) - 1) +
           (ulong)(pppNVar12 == (_Map_pointer)0x0)) * 0x40;
  uVar57 = -(ulong)(uVar57 >> 0x3d != 0) | uVar57 * 8;
  __s = (aiNode **)operator_new__(uVar57);
  memset(__s,0,uVar57);
  this_00 = local_640;
  paVar36 = local_690;
  local_690->mChildren = __s;
  while (ppNVar58 != ppNVar13) {
    paVar50 = BuildNodes(this_00,*ppNVar58,local_680,local_698);
    uVar34 = paVar36->mNumChildren;
    paVar36->mNumChildren = uVar34 + 1;
    paVar36->mChildren[uVar34] = paVar50;
    paVar50->mParent = paVar36;
    ppNVar58 = ppNVar58 + 1;
    if (ppNVar58 == ppNVar14) {
      ppNVar58 = pppNVar54[1];
      pppNVar54 = pppNVar54 + 1;
      ppNVar14 = ppNVar58 + 0x40;
    }
  }
  return paVar36;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}